

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

void google::ShowUsageWithFlagsMatching
               (char *argv0,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *substrings)

{
  FILE *pFVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  pointer pCVar5;
  reference flag_00;
  undefined8 uVar6;
  google local_e0 [32];
  google local_c0 [32];
  google local_a0 [32];
  __normal_iterator<google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
  local_80;
  __normal_iterator<google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
  local_78;
  __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
  local_70;
  const_iterator flag;
  string local_60 [6];
  bool found_match;
  bool first_directory;
  string last_filename;
  undefined1 local_30 [8];
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> flags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *substrings_local;
  char *argv0_local;
  
  pFVar1 = _stdout;
  flags.
  super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)substrings;
  pcVar3 = Basename(argv0);
  pcVar4 = ProgramUsage();
  fprintf(pFVar1,"%s: %s\n",pcVar3,pcVar4);
  std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::vector
            ((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *)
             local_30);
  GetAllFlags((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *)
              local_30);
  std::__cxx11::string::string(local_60);
  flag._M_current._7_1_ = 1;
  flag._M_current._6_1_ = 0;
  local_78._M_current =
       (CommandLineFlagInfo *)
       std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::begin
                 ((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                   *)local_30);
  __gnu_cxx::
  __normal_iterator<google::CommandLineFlagInfo_const*,std::vector<google::CommandLineFlagInfo,std::allocator<google::CommandLineFlagInfo>>>
  ::__normal_iterator<google::CommandLineFlagInfo*>
            ((__normal_iterator<google::CommandLineFlagInfo_const*,std::vector<google::CommandLineFlagInfo,std::allocator<google::CommandLineFlagInfo>>>
              *)&local_70,&local_78);
  do {
    local_80._M_current =
         (CommandLineFlagInfo *)
         std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::end
                   ((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                     *)local_30);
    bVar2 = __gnu_cxx::operator!=(&local_70,&local_80);
    if (!bVar2) {
      if (((flag._M_current._6_1_ & 1) == 0) &&
         (bVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)flags.
                             super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar2)) {
        fprintf(_stdout,"\n  No modules matched: use -help\n");
      }
      std::__cxx11::string::~string(local_60);
      std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::
      ~vector((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *)
              local_30);
      return;
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)flags.
                       super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
LAB_002914a4:
      pCVar5 = __gnu_cxx::
               __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
               ::operator->(&local_70);
      bVar2 = std::operator==(&pCVar5->description,kStrippedFlagHelp);
      if (!bVar2) {
        flag._M_current._6_1_ = 1;
        pCVar5 = __gnu_cxx::
                 __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
                 ::operator->(&local_70);
        bVar2 = std::operator!=(&pCVar5->filename,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60);
        if (bVar2) {
          pCVar5 = __gnu_cxx::
                   __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
                   ::operator->(&local_70);
          Dirname(local_a0,&pCVar5->filename);
          Dirname(local_c0,(string *)local_60);
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c0);
          std::__cxx11::string::~string((string *)local_c0);
          std::__cxx11::string::~string((string *)local_a0);
          if (bVar2) {
            if ((flag._M_current._7_1_ & 1) == 0) {
              fprintf(_stdout,"\n\n");
            }
            flag._M_current._7_1_ = 0;
          }
          pFVar1 = _stdout;
          __gnu_cxx::
          __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
          ::operator->(&local_70);
          uVar6 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"\n  Flags from %s:\n",uVar6);
          pCVar5 = __gnu_cxx::
                   __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
                   ::operator->(&local_70);
          std::__cxx11::string::operator=(local_60,(string *)&pCVar5->filename);
        }
        pFVar1 = _stdout;
        flag_00 = __gnu_cxx::
                  __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
                  ::operator*(&local_70);
        DescribeOneFlag_abi_cxx11_(local_e0,flag_00);
        uVar6 = std::__cxx11::string::c_str();
        fprintf(pFVar1,"%s",uVar6);
        std::__cxx11::string::~string((string *)local_e0);
      }
    }
    else {
      pCVar5 = __gnu_cxx::
               __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
               ::operator->(&local_70);
      bVar2 = FileMatchesSubstring
                        (&pCVar5->filename,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)flags.
                            super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) goto LAB_002914a4;
    }
    __gnu_cxx::
    __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
    ::operator++(&local_70);
  } while( true );
}

Assistant:

static void ShowUsageWithFlagsMatching(const char *argv0,
                                       const vector<string> &substrings) {
  fprintf(stdout, "%s: %s\n", Basename(argv0), ProgramUsage());

  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);           // flags are sorted by filename, then flagname

  string last_filename;          // so we know when we're at a new file
  bool first_directory = true;   // controls blank lines between dirs
  bool found_match = false;      // stays false iff no dir matches restrict
  for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
       flag != flags.end();
       ++flag) {
    if (substrings.empty() ||
        FileMatchesSubstring(flag->filename, substrings)) {
      // If the flag has been stripped, pretend that it doesn't exist.
      if (flag->description == kStrippedFlagHelp) continue;
      found_match = true;     // this flag passed the match!
      if (flag->filename != last_filename) {                      // new file
        if (Dirname(flag->filename) != Dirname(last_filename)) {  // new dir!
          if (!first_directory)
            fprintf(stdout, "\n\n");   // put blank lines between directories
          first_directory = false;
        }
        fprintf(stdout, "\n  Flags from %s:\n", flag->filename.c_str());
        last_filename = flag->filename;
      }
      // Now print this flag
      fprintf(stdout, "%s", DescribeOneFlag(*flag).c_str());
    }
  }
  if (!found_match && !substrings.empty()) {
    fprintf(stdout, "\n  No modules matched: use -help\n");
  }
}